

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_WahWah.cpp
# Opt level: O2

int WahWah::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  StateVariableFilter *this;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float *pfVar5;
  EffectData *pEVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  float *pfVar12;
  uint uVar13;
  bool bVar14;
  uint uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  
  pEVar6 = UnityAudioEffectState::GetEffectData<WahWah::EffectData>(state);
  fVar20 = (float)(state->field_0).field_0.samplerate;
  fVar16 = (pEVar6->field_0).data.p[0] * fVar20;
  fVar20 = fVar20 * (pEVar6->field_0).data.p[1];
  fVar18 = 1.0;
  fVar17 = 1.0;
  if (1.0 < fVar16) {
    fVar17 = powf(0.01,1.0 / fVar16);
    fVar17 = 1.0 - fVar17;
  }
  if (1.0 < fVar20) {
    fVar18 = powf(0.01,1.0 / fVar20);
    fVar18 = 1.0 - fVar18;
  }
  fVar16 = powf((pEVar6->field_0).data.p[4] * -0.999 + 1.0,3.0);
  lVar11 = 0;
  uVar9 = 0;
  if (0 < inchannels) {
    uVar9 = (ulong)(uint)inchannels;
  }
  for (uVar8 = 0; uVar8 != uVar9; uVar8 = uVar8 + 1) {
    lVar7 = uVar8 * 0x24;
    this = (StateVariableFilter *)((pEVar6->field_0).pad + lVar7 + 0x20);
    *(float *)((long)&pEVar6->field_0 + lVar7 + 0x24) = fVar16;
    *(float *)((long)&pEVar6->field_0 + lVar7 + 0x34) = fVar16;
    pfVar5 = (state->field_0).field_0.sidechainbuffer;
    lVar10 = lVar11;
    pfVar12 = outbuffer;
    uVar13 = length;
    while (bVar14 = uVar13 != 0, uVar13 = uVar13 - 1, bVar14) {
      fVar19 = ABS((*(float *)((long)pfVar5 + lVar10) - *(float *)((long)inbuffer + lVar10)) *
                   (pEVar6->field_0).data.p[7] + *(float *)((long)inbuffer + lVar10));
      fVar20 = this[2].cutoff;
      uVar15 = -(uint)(fVar20 < fVar19);
      fVar20 = (float)(~uVar15 & (uint)fVar18 | uVar15 & (uint)fVar17) * (fVar19 - fVar20) + fVar20;
      this[2].cutoff = fVar20;
      fVar20 = fVar20 * (pEVar6->field_0).data.p[3] + (pEVar6->field_0).data.p[2];
      fVar20 = ((ABS(fVar20) - ABS(fVar20 + -1.4)) + 1.4) * 0.5;
      this->cutoff = fVar20;
      this[1].cutoff = fVar20;
      fVar20 = StateVariableFilter::ProcessLPF(this,*(float *)((long)inbuffer + lVar10));
      StateVariableFilter::ProcessLPF
                ((StateVariableFilter *)((long)&pEVar6->field_0 + lVar7 + 0x30),fVar20);
      uVar1 = this->lpf;
      uVar3 = this->bpf;
      uVar2 = this[1].lpf;
      uVar4 = this[1].bpf;
      fVar20 = (pEVar6->field_0).data.p[6];
      fVar19 = fVar20 * ((float)uVar2 - (float)uVar1) + (float)uVar1;
      *pfVar12 = ((fVar20 * ((float)uVar4 - (float)uVar3) + (float)uVar3) - fVar19) *
                 (pEVar6->field_0).data.p[5] + fVar19;
      lVar10 = lVar10 + (long)inchannels * 4;
      pfVar12 = pfVar12 + outchannels;
    }
    lVar11 = lVar11 + 4;
    outbuffer = outbuffer + 1;
  }
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData::Data* data = &state->GetEffectData<EffectData>()->data;

        const float atksamples = data->p[P_ATK] * state->samplerate;
        const float relsamples = data->p[P_REL] * state->samplerate;
        const float atkconst = (atksamples <= 1.0f) ? 1.0f : (1.0f - powf(0.01f, 1.0f / atksamples));
        const float relconst = (relsamples <= 1.0f) ? 1.0f : (1.0f - powf(0.01f, 1.0f / relsamples));
        const float bw = powf(1.0f - 0.999f * data->p[P_RESO], 3.0f);

        for (int i = 0; i < inchannels; i++)
        {
            EffectData::Data::Channel& ch = data->channels[i];
            ch.filter1.bandwidth = bw;
            ch.filter2.bandwidth = bw;
            float* src = inbuffer + i;
            float* dst = outbuffer + i;
            float* sc = state->sidechainbuffer + i;
            for (unsigned int n = 0; n < length; n++)
            {
                float s = *src;
                float a = fabsf(s + (*sc - s) * data->p[P_SIDECHAIN]);
                ch.env += (a - ch.env) * ((a > ch.env) ? atkconst : relconst);
                ch.filter1.cutoff = FastClip(data->p[P_BASE] + ch.env * data->p[P_SENS], 0.0f, 1.4f);
                ch.filter2.cutoff = ch.filter1.cutoff;
                ch.filter2.ProcessLPF(ch.filter1.ProcessLPF(*src));
                float lpf = ch.filter1.lpf + (ch.filter2.lpf - ch.filter1.lpf) * data->p[P_DEPTH];
                float bpf = ch.filter1.bpf + (ch.filter2.bpf - ch.filter1.bpf) * data->p[P_DEPTH];
                *dst = lpf + (bpf - lpf) * data->p[P_TYPE];
                src += inchannels;
                dst += outchannels;
                sc += inchannels;
            }
        }

        return UNITY_AUDIODSP_OK;
    }